

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *enumNode,Reader *replacement)

{
  Reader local_90;
  uint local_5c;
  undefined1 local_58 [4];
  uint replacementSize;
  uint local_24;
  Reader *pRStack_20;
  uint size;
  Reader *replacement_local;
  Reader *enumNode_local;
  CompatibilityChecker *this_local;
  
  pRStack_20 = replacement;
  replacement_local = enumNode;
  enumNode_local = (Reader *)this;
  capnp::schema::Node::Enum::Reader::getEnumerants((Reader *)local_58,enumNode);
  local_24 = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::size((Reader *)local_58);
  capnp::schema::Node::Enum::Reader::getEnumerants(&local_90,pRStack_20);
  local_5c = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::size(&local_90);
  if (local_24 < local_5c) {
    replacementIsNewer(this);
  }
  else if (local_5c < local_24) {
    replacementIsOlder(this);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Enum::Reader& enumNode,
                          const schema::Node::Enum::Reader& replacement) {
    uint size = enumNode.getEnumerants().size();
    uint replacementSize = replacement.getEnumerants().size();
    if (replacementSize > size) {
      replacementIsNewer();
    } else if (replacementSize < size) {
      replacementIsOlder();
    }
  }